

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_-1,_1>,_Eigen::internal::IndexBased,_double>
::unary_evaluator(unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,_1,_3,_1,_1,_3>,__1,_1>,_Eigen::internal::IndexBased,_double>
                  *this,XprType *replicate)

{
  _MatrixTypeNested *p_Var1;
  PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *pPVar2;
  Index IVar3;
  XprType *replicate_local;
  unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,_1,_3,_1,_1,_3>,__1,_1>,_Eigen::internal::IndexBased,_double>
  *this_local;
  
  evaluator_base<Eigen::Replicate<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_-1,_1>_>::evaluator_base
            ((evaluator_base<Eigen::Replicate<Eigen::Matrix<double,_1,_3,_1,_1,_3>,__1,_1>_> *)this)
  ;
  p_Var1 = Replicate<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_-1,_1>::nestedExpression(replicate);
  this->m_arg = p_Var1;
  evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::evaluator(&this->m_argImpl,this->m_arg);
  pPVar2 = &Replicate<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_-1,_1>::nestedExpression(replicate)->
            super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>;
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::rows(pPVar2);
  variable_if_dynamic<long,_1>::variable_if_dynamic
            ((variable_if_dynamic<long,_1> *)&this->field_0x10,IVar3);
  pPVar2 = &Replicate<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_-1,_1>::nestedExpression(replicate)->
            super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>;
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::cols(pPVar2);
  variable_if_dynamic<long,_3>::variable_if_dynamic
            ((variable_if_dynamic<long,_3> *)&this->field_0x11,IVar3);
  return;
}

Assistant:

explicit unary_evaluator(const XprType& replicate)
    : m_arg(replicate.nestedExpression()),
      m_argImpl(m_arg),
      m_rows(replicate.nestedExpression().rows()),
      m_cols(replicate.nestedExpression().cols())
  {}